

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bstrListDestroy(bstrList *sl)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = -1;
  if (sl != (bstrList *)0x0) {
    iVar2 = sl->qty;
    iVar1 = -1;
    if (-1 < iVar2) {
      if (iVar2 != 0) {
        lVar3 = 0;
        do {
          if (sl->entry[lVar3] != (bstring)0x0) {
            bdestroy(sl->entry[lVar3]);
            sl->entry[lVar3] = (bstring)0x0;
            iVar2 = sl->qty;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < iVar2);
      }
      free(sl);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int bstrListDestroy (struct bstrList * sl) {
int i;
	if (sl == NULL || sl->qty < 0) return BSTR_ERR;
	for (i=0; i < sl->qty; i++) {
		if (sl->entry[i]) {
			bdestroy (sl->entry[i]);
			sl->entry[i] = NULL;
		}
	}
	sl->qty = -1;
	bstr__free (sl);
	return BSTR_OK;
}